

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O3

int Abc_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  undefined8 *puVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  puVar1 = (undefined8 *)pAbc->pAbcPla;
  bVar3 = false;
  Extra_UtilGetoptReset();
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar7 = Extra_UtilGetopt(argc,argv,"madvh"), iVar7 == 0x76) {
          bVar4 = (bool)(bVar4 ^ 1);
        }
        if (99 < iVar7) break;
        if (iVar7 == -1) {
          if (puVar1 == (undefined8 *)0x0) {
            Abc_Print(1,"Abc_CommandPs(): There is no current design.\n");
            return 0;
          }
          uVar16 = 0;
          printf("%-16s :  ",*puVar1);
          printf("In =%4d  ",(ulong)*(uint *)((long)puVar1 + 0x14));
          printf("Out =%4d  ",(ulong)*(uint *)(puVar1 + 3));
          printf("Cube =%8d  ",(ulong)*(uint *)((long)puVar1 + 0x2c));
          if ((long)*(int *)((long)puVar1 + 0x2c) < 1) goto LAB_003fd6ff;
          lVar9 = 0;
          goto LAB_003fd5c1;
        }
        if (iVar7 != 0x61) goto LAB_003fd45d;
        bVar5 = (bool)(bVar5 ^ 1);
      }
      if (iVar7 != 100) break;
      bVar6 = (bool)(bVar6 ^ 1);
    }
    if (iVar7 != 0x6d) break;
    bVar3 = (bool)(bVar3 ^ 1);
  }
LAB_003fd45d:
  Abc_Print(-2,"usage: |ps [-madvh]\n");
  Abc_Print(-2,"\t         prints statistics\n");
  pcVar10 = "yes";
  pcVar8 = "yes";
  if (!bVar3) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-m     : toggle printing multipliers [default = %s]\n",pcVar8);
  pcVar8 = "yes";
  if (!bVar5) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-a     : toggle printing adders [default = %s]\n",pcVar8);
  pcVar8 = "yes";
  if (!bVar6) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle printing distrubition [default = %s]\n",pcVar8);
  if (!bVar4) {
    pcVar10 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar10);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
  while( true ) {
    if (0 < *(int *)((long)puVar1 + 0x14)) {
      uVar11 = 0;
      do {
        uVar11 = uVar11 + 2;
      } while ((*(int *)((long)puVar1 + 0x14) + 1U & 0xfffffffe) != uVar11);
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == *(int *)((long)puVar1 + 0x2c)) break;
LAB_003fd5c1:
    lVar12 = lVar9 * *(int *)((long)puVar1 + 0x1c);
    if ((lVar12 < 0) || (*(int *)((long)puVar1 + 0x4c) <= lVar12)) goto LAB_003fd8ea;
  }
LAB_003fd6ff:
  printf("LitIn =%8d  ");
  if (0 < (long)*(int *)((long)puVar1 + 0x2c)) {
    lVar9 = 0;
    uVar16 = 0;
    do {
      lVar12 = lVar9 * *(int *)(puVar1 + 4);
      if ((lVar12 < 0) || (*(int *)((long)puVar1 + 0x5c) <= lVar12)) {
LAB_003fd8ea:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      iVar7 = *(int *)(puVar1 + 3);
      if (0 < iVar7) {
        lVar12 = lVar12 * 8 + puVar1[0xc];
        uVar13 = 0;
        auVar15 = ZEXT416(uVar16);
        uVar16 = 0;
        uVar11 = 1;
        do {
          auVar17 = auVar15;
          auVar14._0_4_ = -(uint)((int)(iVar7 - 1U ^ 0x80000000) < (int)(uVar16 ^ 0x80000000));
          auVar14._4_4_ = -(uint)((int)(iVar7 - 1U ^ 0x80000000) < (int)(uVar11 ^ 0x80000000));
          auVar14._8_8_ = 0;
          auVar18 = auVar17;
          if ((~auVar14._0_4_ & 1) != 0) {
            auVar18._8_8_ = 0;
            auVar18._0_8_ = *(ulong *)(lVar12 + (ulong)(uVar13 >> 5) * 8);
          }
          if ((((ushort)auVar14._4_4_ ^ 0xffff) & 1) != 0) {
            auVar18._8_8_ = *(undefined8 *)(lVar12 + (ulong)(uVar13 >> 5) * 8);
          }
          auVar19._4_4_ = uVar11 * 2;
          auVar19._0_4_ = uVar16 * 2;
          auVar19._8_8_ = 0;
          auVar20._4_12_ = SUB1612((undefined1  [16])0x0,4);
          auVar20._0_4_ = SUB164(auVar19 & _DAT_009c4e10,0);
          uVar2 = (uint)(((uint)(auVar18._8_8_ >> (SUB168(auVar19 & _DAT_009c4e10,0) >> 0x20)) & 3)
                        == 2);
          auVar15._0_4_ = auVar17._0_4_ + (uint)(((uint)(auVar18._0_8_ >> auVar20._0_8_) & 3) == 2);
          auVar15._4_4_ = auVar17._4_4_ + uVar2;
          auVar15._8_4_ = auVar17._8_4_ + uVar2;
          auVar15._12_4_ = auVar17._12_4_ + uVar2;
          uVar13 = uVar13 + 2;
          uVar16 = uVar16 + 2;
          uVar11 = uVar11 + 2;
        } while ((iVar7 + 1U & 0xfffffffe) != uVar13);
        auVar15 = ~auVar14 & auVar15 | auVar17 & auVar14;
        uVar16 = auVar15._4_4_ + auVar15._0_4_;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != *(int *)((long)puVar1 + 0x2c));
  }
  printf("LitOut =%8d  ",(ulong)uVar16);
  printf("Div =%6d  ",(ulong)*(uint *)((long)puVar1 + 0x8c));
  putchar(10);
  return 0;
}

Assistant:

int Abc_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int fShowCones   = 0;
    int fShowMulti   = 0;
    int fShowAdder   = 0;
    int fShowMem     = 0;
    int fDistrib     = 0;
    int fTwoSides    = 0;
    int fAllObjects  = 0;
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cbamdtovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fShowCones ^= 1;
            break;
        case 'b':
            fShowMulti ^= 1;
            break;
        case 'a':
            fShowAdder ^= 1;
            break;
        case 'm':
            fShowMem ^= 1;
            break;
        case 'd':
            fDistrib ^= 1;
            break;
        case 't':
            fTwoSides ^= 1;
            break;
        case 'o':
            fAllObjects ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandPs(): There is no current design.\n" );
        return 0;
    }
    Wlc_NtkPrintStats( pNtk, fDistrib, fTwoSides, fVerbose );
    if ( fShowCones )
        Wlc_NtkProfileCones( pNtk ); 
    if ( fShowMulti )
        Wlc_NtkPrintNodes( pNtk, WLC_OBJ_ARI_MULTI );
    if ( fShowAdder )
        Wlc_NtkPrintNodes( pNtk, WLC_OBJ_ARI_ADD );
    if ( fShowMem )
        Wlc_NtkPrintMemory( pNtk );
    if ( fAllObjects )
        Wlc_NtkPrintObjects( pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%ps [-cbamdtovh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-c     : toggle printing cones [default = %s]\n",                 fShowCones? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle printing multipliers [default = %s]\n",           fShowMulti? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle printing adders [default = %s]\n",                fShowAdder? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle printing memories [default = %s]\n",              fShowMem?   "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle printing distrubition [default = %s]\n",          fDistrib?   "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle printing stats for LHS and RHS [default = %s]\n", fTwoSides?  "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle printing all objects [default = %s]\n",           fAllObjects?"yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",   fVerbose?   "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}